

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::ConsoleAssertionPrinter::printOriginalExpression
          (ConsoleAssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  string local_48;
  Colour local_11;
  ConsoleAssertionPrinter *pCStack_10;
  Colour colourGuard;
  ConsoleAssertionPrinter *this_local;
  
  pCStack_10 = this;
  bVar2 = AssertionResult::hasExpression(this->result);
  if (bVar2) {
    Colour::Colour(&local_11,Cyan);
    std::operator<<((ostream *)this->stream,"  ");
    poVar1 = (ostream *)this->stream;
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_48,this->result);
    std::operator<<(poVar1,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::operator<<((ostream *)this->stream,'\n');
    Colour::~Colour(&local_11);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
        if (result.hasExpression()) {
            Colour colourGuard(Colour::OriginalExpression);
            stream << "  ";
            stream << result.getExpressionInMacro();
            stream << '\n';
        }
    }